

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

void __thiscall CoreReadTask::execute(CoreReadTask *this)

{
  char cVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  int c;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t chunk;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  long local_1f0;
  uint local_1e8;
  
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  iVar2 = exr_read_scanline_chunk_info(this->_f,0,this->_y);
  if (iVar2 == 0) {
    uVar8 = 0;
    iVar2 = exr_decoding_initialize(this->_f,0,&local_238,&local_1f0);
    if (iVar2 == 0) {
      puVar3 = this->_ptr;
      uVar5 = (ulong)local_1e8;
      if ((short)local_1e8 < 1) {
        uVar5 = uVar8;
      }
      for (lVar7 = 0; iVar2 = (int)uVar8, (uVar5 & 0xffff) * 0x30 - lVar7 != 0; lVar7 = lVar7 + 0x30
          ) {
        uVar8 = (ulong)(uint)(iVar2 + *(char *)(local_1f0 + 0x19 + lVar7));
      }
      lVar7 = 0;
      uVar4 = local_1e8;
      for (lVar6 = 0; lVar6 < (short)uVar4; lVar6 = lVar6 + 1) {
        *(uint8_t **)(local_1f0 + 0x28 + lVar7) = puVar3;
        *(int *)(local_1f0 + 0x20 + lVar7) = iVar2;
        *(int *)(local_1f0 + 0x24 + lVar7) = *(int *)(local_1f0 + 0xc + lVar7) * iVar2;
        cVar1 = *(char *)(local_1f0 + 0x19 + lVar7);
        *(short *)(local_1f0 + 0x1c + lVar7) = (short)cVar1;
        puVar3 = puVar3 + cVar1;
        uVar4 = local_1e8 & 0xffff;
        lVar7 = lVar7 + 0x30;
      }
      iVar2 = exr_decoding_choose_default_routines(this->_f,0,&local_1f0);
      if (iVar2 == 0) {
        exr_decoding_run(this->_f,0,&local_1f0);
      }
    }
  }
  exr_decoding_destroy(this->_f,&local_1f0);
  return;
}

Assistant:

void execute () override
    {
        exr_chunk_info_t      cinfo = {0};
        exr_decode_pipeline_t chunk;
        exr_result_t rv = exr_read_scanline_chunk_info (_f, 0, _y, &cinfo);
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_decoding_initialize (_f, 0, &cinfo, &chunk);
        if (rv == EXR_ERR_SUCCESS)
        {
            uint8_t* curchanptr    = _ptr;
            int      bytesperpixel = 0;
            for (int c = 0; c < chunk.channel_count; ++c)
                bytesperpixel += chunk.channels[c].bytes_per_element;
            for (int c = 0; c < chunk.channel_count; ++c)
            {
                exr_coding_channel_info_t& outc = chunk.channels[c];
                outc.decode_to_ptr              = curchanptr;
                outc.user_pixel_stride          = bytesperpixel;
                outc.user_line_stride           = outc.width * bytesperpixel;
                outc.user_bytes_per_element =
                    chunk.channels[c].bytes_per_element;
                curchanptr += chunk.channels[c].bytes_per_element;
            }

            rv = exr_decoding_choose_default_routines (_f, 0, &chunk);
        }
        if (rv == EXR_ERR_SUCCESS) rv = exr_decoding_run (_f, 0, &chunk);
        exr_decoding_destroy (_f, &chunk);
    }